

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall
module_weight_csv_actions::module_start(module_weight_csv_actions *this,string *module)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->weight_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                      s_csv_separator_abi_cxx11_._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(module->_M_dataplus)._M_p,module->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
             s_csv_separator_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << weight_ << s_csv_separator << module << s_csv_separator;
    }